

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::shrSI8x16(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Type *__return_storage_ptr___00;
  uint uVar1;
  long lVar2;
  Literal *pLVar3;
  undefined1 local_1e8 [8];
  LaneArray<16> lanes;
  anon_union_16_5_9943fe1e_for_Literal_0 local_50;
  undefined8 local_40;
  Literal *local_38;
  
  local_38 = __return_storage_ptr__;
  if ((other->type).id == 2) {
    getLanes<signed_char,16>((LaneArray<16> *)local_1e8,(wasm *)this,other);
    __return_storage_ptr___00 = &lanes._M_elems[0xf].type;
    for (lVar2 = 0; pLVar3 = local_38, lVar2 != 0x180; lVar2 = lVar2 + 0x18) {
      pLVar3 = (Literal *)(local_1e8 + lVar2);
      uVar1 = geti32(other);
      local_50.i32 = uVar1 & 7;
      local_40 = 2;
      shrS((Literal *)__return_storage_ptr___00,pLVar3,(Literal *)&local_50.func);
      if (pLVar3 != (Literal *)__return_storage_ptr___00) {
        ~Literal(pLVar3);
        Literal(pLVar3,(Literal *)__return_storage_ptr___00);
      }
      ~Literal((Literal *)__return_storage_ptr___00);
      ~Literal((Literal *)&local_50.func);
    }
    Literal(local_38,(LaneArray<16> *)local_1e8);
    std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)local_1e8);
    return pLVar3;
  }
  __assert_fail("shift.type == Type::i32",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                ,0x785,
                "Literal wasm::shift(const Literal &, const Literal &) [Lanes = 16, IntoLanes = &wasm::Literal::getLanesSI8x16, ShiftOp = &wasm::Literal::shrS]"
               );
}

Assistant:

Literal Literal::shrSI8x16(const Literal& other) const {
  return shift<16, &Literal::getLanesSI8x16, &Literal::shrS>(*this, other);
}